

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeHardening
          (ChElementHexaANCF_3813_9 *this,double alpha,double *val,double *der)

{
  ChVectorDynamic<double> *this_00;
  double dVar1;
  double dVar2;
  Scalar SVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scalar *pSVar7;
  ChVectorDynamic<double> *pCVar8;
  long index;
  Index index_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  this_00 = &this->m_DPVector1;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
  if (*pSVar7 <= alpha) {
    for (index_00 = 1; index_00 < this->m_DPVector_size; index_00 = index_00 + 1) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index_00);
      if (alpha <= *pSVar7) {
        index = index_00 + -1;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        dVar12 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index_00);
        dVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            index);
        dVar12 = (alpha - dVar12) / (dVar1 - *pSVar7);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &this->m_DPVector2,index);
        SVar3 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &this->m_DPVector2,index_00);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = SVar3;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = 1.0 - dVar12;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar12 * *pSVar7;
        auVar6 = vfmadd231sd_fma(auVar11,auVar15,auVar6);
        *val = auVar6._0_8_;
        goto LAB_00c04e73;
      }
    }
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                        (long)this->m_DPVector_size + -1);
    if (alpha <= *pSVar7) {
      return;
    }
    pCVar8 = &this->m_DPVector2;
    index = (long)this->m_DPVector_size + -2;
    index_00 = (long)this->m_DPVector_size + -1;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,
                        index_00);
    dVar12 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,index);
    dVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                        index_00);
    dVar2 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index)
    ;
    auVar10._0_8_ = (dVar12 - dVar1) / (dVar2 - *pSVar7);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index)
    ;
    dVar12 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,index);
    auVar10._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = alpha - dVar12;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pSVar7;
    auVar6 = vfmadd213sd_fma(auVar14,auVar10,auVar5);
    *val = auVar6._0_8_;
LAB_00c04e73:
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->m_DPVector2,index_00);
    dVar12 = *pSVar7;
  }
  else {
    pCVar8 = &this->m_DPVector2;
    index_00 = 1;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,1);
    dVar12 = *pSVar7;
    index = 0;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,0);
    dVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
    dVar2 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    auVar9._0_8_ = (dVar12 - dVar1) / (dVar2 - *pSVar7);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    dVar12 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,0);
    auVar9._8_8_ = 0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = alpha - dVar12;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pSVar7;
    auVar6 = vfmadd213sd_fma(auVar13,auVar9,auVar4);
    *val = auVar6._0_8_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar8,1);
    dVar12 = *pSVar7;
  }
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      &this->m_DPVector2,index);
  dVar1 = *pSVar7;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index_00
                     );
  dVar2 = *pSVar7;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index);
  *der = (dVar12 - dVar1) / (dVar2 - *pSVar7);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeHardening(double alpha, double& val, double& der) {
    // Check if below the table range
    if (alpha < m_DPVector1(0)) {
        val = (m_DPVector2(1) - m_DPVector2(0)) / (m_DPVector1(1) - m_DPVector1(0)) * (alpha - m_DPVector1(0)) +
              m_DPVector2(0);
        der = (m_DPVector2(1) - m_DPVector2(0)) / (m_DPVector1(1) - m_DPVector1(0));
        return;
    }

    // Check if in range
    for (int i0 = 0, i1 = 1; i1 < m_DPVector_size; i0++, i1++) {
        if (alpha <= m_DPVector1(i1)) {
            double wx = (alpha - m_DPVector1(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
            val = (1.0 - wx) * m_DPVector2(i0) + wx * m_DPVector2(i1);
            der = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
            return;
        }
    }

    // Check if above the table range
    if (alpha > m_DPVector1(m_DPVector_size - 1)) {
        int i0 = m_DPVector_size - 2;
        int i1 = m_DPVector_size - 1;
        val = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0)) * (alpha - m_DPVector1(i0)) +
              m_DPVector2(i0);
        der = (m_DPVector2(i1) - m_DPVector2(i0)) / (m_DPVector1(i1) - m_DPVector1(i0));
    }
}